

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wwf.cpp
# Opt level: O1

void clear(void)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  
  start = true;
  if (-2 < bsize) {
    uVar2 = 0;
    do {
      uVar5 = (ulong)(uint)bsize;
      if (-2 < bsize) {
        uVar3 = 0;
        do {
          iVar4 = (int)uVar5 + 1;
          board[uVar2][uVar3] =
               (int)((long)((ulong)(uint)((int)uVar3 >> 0x1f) << 0x20 | uVar3 & 0xffffffff) %
                    (long)iVar4) == 0 ||
               (int)((long)((ulong)(uint)((int)uVar2 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) %
                    (long)iVar4) == 0;
          points[uVar2][uVar3] = 0;
          uVar5 = (ulong)bsize;
          bVar1 = (long)uVar3 <= (long)uVar5;
          uVar3 = uVar3 + 1;
        } while (bVar1);
      }
      bVar1 = (long)uVar2 <= (long)bsize;
      uVar2 = uVar2 + 1;
    } while (bVar1);
  }
  return;
}

Assistant:

void clear() {
    start = true;
    for (int i = 0; i < bsize + 2; i++)
        for (int j = 0; j < bsize + 2; j++) {
            if ((i % (bsize + 1)) * (j % (bsize + 1)) == 0) board[i][j] = 1; else board[i][j] = 0;
            points[i][j] = 0;
        }
}